

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScalableKReach.cpp
# Opt level: O3

void __thiscall ScalableKReach::PartialIndex::update_cover(PartialIndex *this,vertex_t v)

{
  int iVar1;
  pointer puVar2;
  long lVar3;
  uint *puVar4;
  long lVar5;
  degree_t dVar6;
  iterator iVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  uint *puVar9;
  ulong uVar10;
  key_type *pkVar11;
  char *pcVar12;
  __hashtable *__h_1;
  __hashtable *__h;
  vertex_t local_2c;
  
  local_2c = v;
  dVar6 = Graph::num_vertices(this->graph_);
  if (dVar6 != 0) {
    uVar10 = 0;
    do {
      pkVar11 = &local_2c;
      iVar7 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->succ_)._M_h,&local_2c);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
LAB_00108724:
        pcVar12 = "_Map_base::at";
        std::__throw_out_of_range("_Map_base::at");
        lVar3 = **(long **)(pcVar12 + 0x98);
        if ((ulong)((*(long **)(pcVar12 + 0x98))[1] - lVar3 >> 2) <= ((ulong)pkVar11 & 0xffffffff))
        goto LAB_001087fe;
        *(undefined4 *)(lVar3 + ((ulong)pkVar11 & 0xffffffff) * 4) = 0;
        pvVar8 = Graph::successors(*(Graph **)(pcVar12 + 8),(vertex_t)pkVar11);
        puVar9 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar4 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (puVar9 == puVar4) goto LAB_001087ab;
        lVar3 = **(long **)(pcVar12 + 0x98);
        lVar5 = (*(long **)(pcVar12 + 0x98))[1];
        goto LAB_0010878b;
      }
      if ((ulong)(*(long *)((long)iVar7.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                  ._M_cur + 0x18) -
                 *(long *)((long)iVar7.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                 ._M_cur + 0x10)) <= uVar10) goto LAB_00108713;
      if (*(char *)(*(long *)((long)iVar7.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x10) + uVar10) == '?') {
        pkVar11 = &local_2c;
        iVar7 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->pred_)._M_h,&local_2c);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) goto LAB_00108724;
        if ((ulong)(*(long *)((long)iVar7.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                    ._M_cur + 0x18) -
                   *(long *)((long)iVar7.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                   ._M_cur + 0x10)) <= uVar10) goto LAB_00108713;
        if (*(char *)(*(long *)((long)iVar7.
                                      super__Node_iterator_base<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                                      ._M_cur + 0x10) + uVar10) != '?') goto LAB_001086c4;
      }
      else {
LAB_001086c4:
        puVar2 = (this->degree_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->degree_->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar10) {
LAB_00108713:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar10);
        }
        if (puVar2[uVar10] != 0) {
          cover(this,(vertex_t)uVar10);
        }
      }
      uVar10 = uVar10 + 1;
      dVar6 = Graph::num_vertices(this->graph_);
    } while (uVar10 < dVar6);
  }
  return;
  while( true ) {
    iVar1 = *(int *)(lVar3 + uVar10 * 4);
    if (iVar1 != 0) {
      *(int *)(lVar3 + uVar10 * 4) = iVar1 + -1;
    }
    puVar9 = puVar9 + 1;
    if (puVar9 == puVar4) break;
LAB_0010878b:
    uVar10 = (ulong)*puVar9;
    if ((ulong)(lVar5 - lVar3 >> 2) <= uVar10) goto LAB_001087fe;
  }
LAB_001087ab:
  pvVar8 = Graph::predecessors(*(Graph **)(pcVar12 + 8),(vertex_t)pkVar11);
  puVar9 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar9 != puVar4) {
    lVar3 = **(long **)(pcVar12 + 0x98);
    lVar5 = (*(long **)(pcVar12 + 0x98))[1];
    do {
      uVar10 = (ulong)*puVar9;
      if ((ulong)(lVar5 - lVar3 >> 2) <= uVar10) {
LAB_001087fe:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      iVar1 = *(int *)(lVar3 + uVar10 * 4);
      if (iVar1 != 0) {
        *(int *)(lVar3 + uVar10 * 4) = iVar1 + -1;
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar4);
  }
  return;
}

Assistant:

void ScalableKReach::PartialIndex::update_cover(vertex_t v) {
    for (vertex_t j = 0; j < graph_.num_vertices(); ++j) {
        if ((succ_.at(v).at(j) != INF8 || pred_.at(v).at(j) != INF8) &&
            degree_.at(j) > 0) {
            cover(j);
        }
    }
}